

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_test.cpp
# Opt level: O3

void __thiscall PackedArray_speed_Test::TestBody(PackedArray_speed_Test *this)

{
  uint uVar1;
  result_type rVar2;
  long lVar3;
  PackedArray *a;
  ostream *poVar4;
  clock_t cVar5;
  ulong uVar6;
  int bits;
  uint32_t bitsPerItem;
  int iVar7;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offs;
  uniform_int_distribution<unsigned_int> distr;
  mt19937_64 eng;
  random_device rd;
  result_type local_1dcc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1dc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1da8;
  param_type local_1d88;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar1 = std::random_device::_M_getval();
  local_1d80._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar6 = local_1d80._M_x[0];
  do {
    uVar6 = (uVar6 >> 0x3e ^ uVar6) * 0x5851f42d4c957f2d + lVar3;
    local_1d80._M_x[lVar3] = uVar6;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x138);
  local_1d80._M_p = 0x138;
  local_1d88._M_a = 0;
  local_1d88._M_b = 0xffffffff;
  local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_1da8,0x8000000);
  local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_1dc8,0x8000000);
  iVar7 = 0x800;
  do {
    local_1dcc = std::uniform_int_distribution<unsigned_int>::operator()
                           ((uniform_int_distribution<unsigned_int> *)&local_1d88,&local_1d80,
                            &local_1d88);
    if (local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_1dc8,
                 (iterator)
                 local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1dcc);
    }
    else {
      *local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1dcc;
      local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_1d88,&local_1d80,&local_1d88
                      );
    local_1dcc = rVar2 & 0x7ff;
    if (local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_1da8,
                 (iterator)
                 local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1dcc);
    }
    else {
      *local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = local_1dcc;
      local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  bitsPerItem = 1;
  do {
    a = PackedArray_create(bitsPerItem,0x800);
    lVar3 = 0;
    do {
      PackedArray_set(a,local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar3],
                      local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x8000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bits=",5);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,bitsPerItem);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"speed: ",7);
    cVar5 = clock();
    lVar3 = cVar5 - gClock;
    gClock = cVar5;
    poVar4 = std::ostream::_M_insert<double>(128.0 / ((double)lVar3 / 1000000.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"MEl",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    bitsPerItem = bitsPerItem + 1;
  } while (bitsPerItem != 0x20);
  if (local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1dc8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1da8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

TEST(PackedArray, speed) {
    std::random_device rd;     //Get a random seed from the OS entropy device, or whatever
    std::mt19937_64 eng(rd());
    std::uniform_int_distribution<uint32_t> distr;

    const unsigned tot = 128*1024*1024;
    const unsigned els = 2048;

    vector<uint32_t> offs;
    offs.reserve(tot);
    vector<uint32_t> val;
    val.reserve(tot);

    for (int a = 0; a < els; a++) {
        val.push_back(distr(eng));
        offs.push_back(distr(eng) & (els-1));
    }

    for (int bits = 1; bits < 32; bits++) {

        PackedArray *pa = PackedArray_create(bits, els);
        for(int i =0; i<tot; i++) {
            PackedArray_set(pa, offs[i], val[i]);
        }

        cerr << "bits="<<bits <<"speed: "<< tot / 1024 / 1024/ relClockOffset() << "MEl"<< "\n";
    }
}